

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_extDict_6
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  BYTE *__s1;
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  U32 UVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  U32 UVar20;
  BYTE *pBVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint local_f4;
  uint *local_f0;
  uint *local_e0;
  uint local_cc;
  uint local_84;
  ZSTD_matchState_t *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_match_t *local_50;
  size_t local_48;
  U32 *local_40;
  U32 *local_38;
  
  local_50 = matches;
  if ((ms->cParams).minMatch < 6) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar21 = (ms->window).base;
  uVar17 = (ulong)ms->nextToUpdate;
  if (ip < pBVar21 + uVar17) {
    return 0;
  }
  UVar20 = 1;
  local_80 = ms;
  while( true ) {
    uVar23 = (uint)uVar17;
    uVar11 = (uint)((long)ip - (long)pBVar21);
    if (uVar11 <= uVar23) break;
    UVar4 = ZSTD_insertBt1(ms,pBVar21 + uVar17,iHighLimit,uVar11,6,1);
    uVar17 = (ulong)(UVar4 + uVar23);
    if (UVar4 + uVar23 <= uVar23) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815a,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar21) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815d,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar21) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x815e,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar11;
  uVar11 = (ms->cParams).targetLength;
  uVar23 = 0xfff;
  if (uVar11 < 0xfff) {
    uVar23 = uVar11;
  }
  uVar11 = (ms->cParams).hashLog;
  if (0x20 < uVar11) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  pBVar21 = (ms->window).base;
  uVar24 = (int)ip - (int)pBVar21;
  pUVar3 = ms->hashTable;
  local_48 = ZSTD_hash6Ptr(ip,uVar11);
  uVar18 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar17 = 0;
  uVar11 = uVar24 - uVar18;
  if (uVar24 < uVar18) {
    uVar11 = 0;
  }
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar1 = (ms->window).lowLimit;
  uVar16 = uVar24 - uVar13;
  if (uVar24 - uVar1 <= uVar13) {
    uVar16 = uVar1;
  }
  if (ms->loadedDictEnd != 0) {
    uVar16 = uVar1;
  }
  uVar1 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x819e,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  uVar2 = pUVar3[local_48];
  local_38 = ms->chainTable;
  local_58 = (ms->window).dictBase;
  uVar13 = (ms->window).dictLimit;
  uVar19 = (ulong)uVar13;
  local_70 = local_58 + uVar19;
  local_78 = pBVar21 + uVar19;
  uVar6 = (ulong)((uVar18 & uVar24) * 2);
  local_e0 = local_38 + uVar6;
  local_f0 = local_38 + uVar6 + 1;
  local_f4 = uVar24 + 9;
  uVar6 = (ulong)(lengthToBeat - 1);
  local_68 = ip + 4;
  local_60 = pBVar21;
  local_40 = pUVar3;
  for (uVar22 = (ulong)ll0; ll0 + 3 != uVar22; uVar22 = uVar22 + 1) {
    if (uVar22 == 3) {
      uVar12 = *rep - 1;
    }
    else {
      uVar12 = rep[uVar22];
    }
    if (uVar24 < uVar13) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81a5,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    uVar14 = uVar24 - uVar12;
    if (uVar12 - 1 < uVar24 - uVar13) {
      uVar8 = 0;
      if ((uVar16 <= uVar14) && (*(int *)ip == *(int *)(ip + -(ulong)uVar12))) {
        sVar7 = ZSTD_count(local_68,local_68 + -(ulong)uVar12,iHighLimit);
        iVar5 = (int)sVar7;
LAB_001d7e4b:
        uVar8 = (ulong)(iVar5 + 4);
      }
    }
    else {
      if (uVar24 < uVar16) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81b1,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar8 = 0;
      if (((uVar12 - 1 < uVar24 - uVar16) && (uVar14 - uVar13 < 0xfffffffd)) &&
         (*(int *)ip == *(int *)(local_58 + uVar14))) {
        sVar7 = ZSTD_count_2segments
                          (local_68,(BYTE *)((long)(local_58 + uVar14) + 4),iHighLimit,local_70,
                           local_78);
        iVar5 = (int)sVar7;
        goto LAB_001d7e4b;
      }
    }
    if (uVar6 < uVar8) {
      local_50[uVar17].off = UVar20;
      local_50[uVar17].len = (uint)uVar8;
      uVar12 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar12;
      if (uVar23 < (uint)uVar8) {
        return uVar12;
      }
      uVar6 = uVar8;
      if (ip + uVar8 == iHighLimit) {
        return uVar12;
      }
    }
    UVar20 = UVar20 + 1;
  }
  local_40[local_48] = uVar24;
  uVar22 = 0;
  uVar8 = 0;
  local_cc = 1 << ((byte)uVar1 & 0x1f);
  do {
    uVar15 = (ulong)uVar2;
    UVar20 = (U32)uVar17;
    if ((local_cc == 0) || (uVar2 < uVar16 + (uVar16 == 0))) goto LAB_001d80d7;
    uVar9 = uVar22;
    if (uVar8 < uVar22) {
      uVar9 = uVar8;
    }
    if (uVar24 <= uVar2) {
      __assert_fail("curr > matchIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x81f1,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (uVar15 + uVar9 < uVar19) {
      __s1 = local_58 + uVar15;
      iVar5 = bcmp(__s1,ip,uVar9);
      if (iVar5 != 0) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81fa,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar7 = ZSTD_count_2segments(ip + uVar9,__s1 + uVar9,iHighLimit,local_70,local_78);
      uVar9 = sVar7 + uVar9;
      pBVar21 = local_60 + uVar15;
      if (uVar9 + uVar15 < uVar19) {
        pBVar21 = __s1;
      }
    }
    else {
      pBVar21 = local_60 + uVar15;
      if ((uVar13 <= uVar2) && (iVar5 = bcmp(pBVar21,ip,uVar9), iVar5 != 0)) {
        __assert_fail("memcmp(match, ip, matchLength) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81f6,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      sVar7 = ZSTD_count(ip + uVar9,pBVar21 + uVar9,iHighLimit);
      uVar9 = sVar7 + uVar9;
    }
    if (uVar6 < uVar9) {
      if (local_f4 < uVar2 || local_f4 - uVar2 == 0) {
        __assert_fail("matchEndIdx > matchIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8203,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_f4 - uVar2 < uVar9) {
        local_f4 = uVar2 + (U32)uVar9;
      }
      local_50[uVar17].off = (uVar24 + 3) - uVar2;
      local_50[uVar17].len = (U32)uVar9;
      UVar20 = UVar20 + 1;
      uVar17 = (ulong)UVar20;
      if ((0x1000 < uVar9) || (uVar6 = uVar9, ip + uVar9 == iHighLimit)) goto LAB_001d80d7;
    }
    UVar20 = (U32)uVar17;
    puVar10 = local_38 + (uVar2 & uVar18) * 2;
    if (pBVar21[uVar9] < ip[uVar9]) {
      *local_e0 = uVar2;
      if (uVar2 <= uVar11) {
        local_e0 = &local_84;
LAB_001d80d7:
        *local_f0 = 0;
        *local_e0 = 0;
        if (0x40000000 < local_cc) {
          __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8221,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        if (uVar24 + 8 < local_f4) {
          local_80->nextToUpdate = local_f4 - 8;
          return UVar20;
        }
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8248,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      puVar10 = puVar10 + 1;
      uVar8 = uVar9;
      local_e0 = puVar10;
    }
    else {
      *local_f0 = uVar2;
      local_f0 = puVar10;
      uVar22 = uVar9;
      if (uVar2 <= uVar11) {
        local_f0 = &local_84;
        goto LAB_001d80d7;
      }
    }
    uVar2 = *puVar10;
    local_cc = local_cc - 1;
  } while( true );
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}